

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

void __thiscall
t_netstd_generator::generate_netstd_union_class
          (t_netstd_generator *this,ostream *out,t_struct *tunion,t_field *tfield)

{
  string *psVar1;
  int *piVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  string *this_00;
  char *this_01;
  string copy_op;
  string local_f0;
  bool needs_typecast;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"public ");
  type_name_abi_cxx11_(&local_f0,this,tfield->type_,true);
  poVar4 = std::operator<<(poVar4,(string *)&local_f0);
  poVar4 = std::operator<<(poVar4," As_");
  psVar1 = &tfield->name_;
  poVar4 = std::operator<<(poVar4,(string *)psVar1);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&copy_op);
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&copy_op);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"get");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&copy_op);
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&copy_op);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"return (");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,tfield->key_);
  poVar4 = std::operator<<(poVar4," == Isset) ? (");
  type_name_abi_cxx11_(&local_f0,this,tfield->type_,true);
  poVar4 = std::operator<<(poVar4,(string *)&local_f0);
  poVar4 = std::operator<<(poVar4,")Data : default(");
  type_name_abi_cxx11_((string *)&needs_typecast,this,tfield->type_,true);
  poVar4 = std::operator<<(poVar4,(string *)&needs_typecast);
  poVar4 = std::operator<<(poVar4,");");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&needs_typecast);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&copy_op);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&copy_op);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&copy_op);
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"public class ");
  poVar4 = std::operator<<(poVar4,(string *)psVar1);
  poVar4 = std::operator<<(poVar4," : ");
  iVar3 = (*(tunion->super_t_type).super_t_doc._vptr_t_doc[3])(tunion);
  poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var,iVar3));
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&copy_op);
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&copy_op);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"private ");
  type_name_abi_cxx11_(&local_f0,this,tfield->type_,true);
  poVar4 = std::operator<<(poVar4,(string *)&local_f0);
  poVar4 = std::operator<<(poVar4," _data;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_((string *)&needs_typecast,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&needs_typecast);
  poVar4 = std::operator<<(poVar4,"public override object Data { get { return _data; } }");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_70);
  poVar4 = std::operator<<(poVar4,"public ");
  poVar4 = std::operator<<(poVar4,(string *)psVar1);
  poVar4 = std::operator<<(poVar4,"(");
  type_name_abi_cxx11_(&local_90,this,tfield->type_,true);
  poVar4 = std::operator<<(poVar4,(string *)&local_90);
  poVar4 = std::operator<<(poVar4," data) : base(");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,tfield->key_);
  poVar4 = std::operator<<(poVar4,")");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_b0);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&needs_typecast);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&copy_op);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"this._data = data;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&copy_op);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&copy_op);
  if (this->suppress_deepcopy == false) {
    t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&copy_op);
    poVar4 = std::operator<<(poVar4,"public new ");
    poVar4 = std::operator<<(poVar4,(string *)psVar1);
    poVar4 = std::operator<<(poVar4," DeepCopy()");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&copy_op);
    t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&copy_op);
    poVar4 = std::operator<<(poVar4,"{");
    this_00 = &::endl_abi_cxx11_;
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&copy_op);
    piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar2 = *piVar2 + 1;
    needs_typecast = false;
    get_deep_copy_method_call_abi_cxx11_
              (&copy_op,(t_netstd_generator *)this_00,tfield->type_,&needs_typecast);
    t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_f0);
    poVar4 = std::operator<<(poVar4,"return new ");
    poVar4 = std::operator<<(poVar4,(string *)psVar1);
    poVar4 = std::operator<<(poVar4,"(_data");
    poVar4 = std::operator<<(poVar4,(string *)&copy_op);
    poVar4 = std::operator<<(poVar4,");");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_f0);
    piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar2 = *piVar2 + -1;
    t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_f0);
    poVar4 = std::operator<<(poVar4,"}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&copy_op);
  }
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"public override bool Equals(object that)");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&copy_op);
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&copy_op);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"if (!(that is ");
  iVar3 = (*(tunion->super_t_type).super_t_doc._vptr_t_doc[3])(tunion);
  poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_00,iVar3));
  poVar4 = std::operator<<(poVar4," other)) return false;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&copy_op);
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"if (ReferenceEquals(this, other)) return true;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&copy_op);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"return Equals( _data, other.As_");
  poVar4 = std::operator<<(poVar4,(string *)psVar1);
  poVar4 = std::operator<<(poVar4,");");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&copy_op);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&copy_op);
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"public override int GetHashCode()");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&copy_op);
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&copy_op);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"return _data.GetHashCode();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&copy_op);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&copy_op);
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,
                           "public override async global::System.Threading.Tasks.Task WriteAsync(TProtocol oprot, CancellationToken "
                          );
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,") {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&copy_op);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"oprot.IncrementRecursionDepth();");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_f0);
  poVar4 = std::operator<<(poVar4,"try");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_((string *)&needs_typecast,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&needs_typecast);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&needs_typecast);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&copy_op);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"var struc = new TStruct(\"");
  iVar3 = (*(tunion->super_t_type).super_t_doc._vptr_t_doc[3])(tunion);
  poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_01,iVar3));
  poVar4 = std::operator<<(poVar4,"\");");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_f0);
  poVar4 = std::operator<<(poVar4,"await oprot.WriteStructBeginAsync(struc, ");
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,");");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&copy_op);
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"var field = new TField();");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_f0);
  poVar4 = std::operator<<(poVar4,"field.Name = \"");
  poVar4 = std::operator<<(poVar4,(string *)psVar1);
  poVar4 = std::operator<<(poVar4,"\";");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_((string *)&needs_typecast,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&needs_typecast);
  this_01 = "field.Type = ";
  poVar4 = std::operator<<(poVar4,"field.Type = ");
  type_to_enum_abi_cxx11_(&local_70,(t_netstd_generator *)this_01,tfield->type_);
  poVar4 = std::operator<<(poVar4,(string *)&local_70);
  poVar4 = std::operator<<(poVar4,";");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_90);
  poVar4 = std::operator<<(poVar4,"field.ID = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,tfield->key_);
  poVar4 = std::operator<<(poVar4,";");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_b0);
  poVar4 = std::operator<<(poVar4,"await oprot.WriteFieldBeginAsync(field, ");
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,");");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&needs_typecast);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&copy_op);
  std::__cxx11::string::string((string *)&local_50,"_data",(allocator *)&copy_op);
  generate_serialize_field(this,out,tfield,&local_50,true);
  std::__cxx11::string::~string((string *)&local_50);
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"await oprot.WriteFieldEndAsync(");
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,");");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_f0);
  poVar4 = std::operator<<(poVar4,"await oprot.WriteFieldStopAsync(");
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,");");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_((string *)&needs_typecast,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&needs_typecast);
  poVar4 = std::operator<<(poVar4,"await oprot.WriteStructEndAsync(");
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,");");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&needs_typecast);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&copy_op);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_f0);
  poVar4 = std::operator<<(poVar4,"finally");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_((string *)&needs_typecast,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&needs_typecast);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&needs_typecast);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&copy_op);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"oprot.DecrementRecursionDepth();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&copy_op);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&copy_op);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&copy_op);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&copy_op,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&copy_op);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&copy_op);
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_union_class(ostream& out, t_struct* tunion, t_field* tfield)
{
    out << indent() << "public " << type_name(tfield->get_type()) << " As_" << tfield->get_name() << endl;
    out << indent() << "{" << endl;
    indent_up();
    out << indent() << "get" << endl;
    out << indent() << "{" << endl;
    indent_up();
    out << indent() << "return (" << tfield->get_key() << " == Isset) ? (" << type_name(tfield->get_type()) << ")Data : default(" << type_name(tfield->get_type()) << ");" << endl;
    indent_down();
    out << indent() << "}" << endl;
    indent_down();
    out << indent() << "}" << endl
        << endl;


    out << indent() << "public class " << tfield->get_name() << " : " << tunion->get_name() << endl;
    out << indent() << "{" << endl;
    indent_up();

    out << indent() << "private " << type_name(tfield->get_type()) << " _data;" << endl
        << indent() << "public override object Data { get { return _data; } }" << endl
        << indent() << "public " << tfield->get_name() << "(" << type_name(tfield->get_type()) << " data) : base("<< tfield->get_key() <<")" << endl
        << indent() << "{" << endl;
    indent_up();
    out << indent() << "this._data = data;" << endl;
    indent_down();
    out << indent() << "}" << endl;

    if( ! suppress_deepcopy) {
        out << indent() << "public new " << tfield->get_name() << " DeepCopy()" << endl;
        out << indent() << "{" << endl;
        indent_up();
        bool needs_typecast = false;
        string copy_op = get_deep_copy_method_call(tfield->get_type(), needs_typecast);
        out << indent() << "return new " << tfield->get_name() << "(_data" << copy_op << ");" << endl;
        indent_down();
        out << indent() << "}" << endl << endl;
    }

    out << indent() << "public override bool Equals(object that)" << endl;
    out << indent() << "{" << endl;
    indent_up();
    out << indent() << "if (!(that is " << tunion->get_name() << " other)) return false;" << endl;
    out << indent() << "if (ReferenceEquals(this, other)) return true;" << endl;
    out << endl;
    out << indent() << "return Equals( _data, other.As_" << tfield->get_name() << ");" << endl;
    indent_down();
    out << indent() << "}" << endl << endl;

    out << indent() << "public override int GetHashCode()" << endl;
    out << indent() << "{" << endl;
    indent_up();
    out << indent() << "return _data.GetHashCode();" << endl;
    indent_down();
    out << indent() << "}" << endl << endl;

    out << indent() << "public override async global::System.Threading.Tasks.Task WriteAsync(TProtocol oprot, CancellationToken " << CANCELLATION_TOKEN_NAME << ") {" << endl;
    indent_up();

    out << indent() << "oprot.IncrementRecursionDepth();" << endl
        << indent() << "try" << endl
        << indent() << "{" << endl;
    indent_up();

    out << indent() << "var struc = new TStruct(\"" << tunion->get_name() << "\");" << endl
        << indent() << "await oprot.WriteStructBeginAsync(struc, " << CANCELLATION_TOKEN_NAME << ");" << endl;

    out << indent() << "var field = new TField();" << endl
        << indent() << "field.Name = \"" << tfield->get_name() << "\";" << endl
        << indent() << "field.Type = " << type_to_enum(tfield->get_type()) << ";" << endl
        << indent() << "field.ID = " << tfield->get_key() << ";" << endl
        << indent() << "await oprot.WriteFieldBeginAsync(field, " << CANCELLATION_TOKEN_NAME << ");" << endl;

    generate_serialize_field(out, tfield, "_data", true);

    out << indent() << "await oprot.WriteFieldEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl
        << indent() << "await oprot.WriteFieldStopAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl
        << indent() << "await oprot.WriteStructEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    indent_down();
    out << indent() << "}" << endl
        << indent() << "finally" << endl
        << indent() << "{" << endl;
    indent_up();
    out << indent() << "oprot.DecrementRecursionDepth();" << endl;
    indent_down();
    out << indent() << "}" << endl;
    indent_down();
    out << indent() << "}" << endl;
    indent_down();
    out << indent() << "}" << endl << endl;
}